

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O2

int fffi4u4(int *input,long ntodo,double scale,double zero,int nullcheck,int tnull,
           unsigned_long nullval,char *nullarray,int *anynull,unsigned_long *output,int *status)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  unsigned_long uVar4;
  ulong uVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    lVar2 = 0;
    if (scale != 1.0 || zero != 2147483648.0) {
      if (0 < ntodo) {
        lVar2 = ntodo;
      }
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
          dVar6 = (double)input[lVar3] * scale + zero;
          if (-0.49 <= dVar6) {
            if (dVar6 <= 1.844674407370955e+19) {
              uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
            }
            else {
              *status = -0xb;
              uVar5 = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            uVar5 = 0;
          }
          output[lVar3] = uVar5;
        }
      }
      else {
        for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
          uVar4 = (unsigned_long)input[lVar3];
          if ((long)uVar4 < 0) {
            *status = -0xb;
            uVar4 = 0;
          }
          output[lVar3] = uVar4;
        }
      }
    }
    else {
      if (ntodo < 1) {
        ntodo = lVar2;
      }
      for (; ntodo != lVar2; lVar2 = lVar2 + 1) {
        output[lVar2] = (ulong)(uint)input[lVar2] ^ 0x80000000;
      }
    }
  }
  else if (scale != 1.0 || zero != 2147483648.0) {
    lVar2 = 0;
    if (0 < ntodo) {
      lVar2 = ntodo;
    }
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        if (input[lVar3] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else {
          dVar6 = (double)input[lVar3] * scale + zero;
          if (-0.49 <= dVar6) {
            if (dVar6 <= 1.844674407370955e+19) {
              output[lVar3] =
                   (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
            }
            else {
              *status = -0xb;
              output[lVar3] = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[lVar3] = 0;
          }
        }
      }
    }
    else {
      for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        uVar1 = input[lVar3];
        if (uVar1 == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else if ((int)uVar1 < 0) {
          *status = -0xb;
          output[lVar3] = 0;
        }
        else {
          output[lVar3] = (ulong)uVar1;
        }
      }
    }
  }
  else {
    lVar2 = 0;
    if (ntodo < 1) {
      ntodo = lVar2;
    }
    for (; ntodo != lVar2; lVar2 = lVar2 + 1) {
      if (input[lVar2] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar2] = nullval;
        }
        else {
          nullarray[lVar2] = '\x01';
        }
      }
      else {
        output[lVar2] = (ulong)(uint)input[lVar2] ^ 0x80000000;
      }
    }
  }
  return *status;
}

Assistant:

int fffi4u4(INT32BIT *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
   unsigned long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 2147483648.)
        {       
           /* Instead of adding 2147483648, it is more efficient */
           /* to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
               output[ii] =  ( *(unsigned int *) &input[ii] ) ^ 0x80000000;
	    }
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else
                    output[ii] = (unsigned long) input[ii]; /* copy input */
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 2147483648.) 
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                   output[ii] =  ( *(unsigned int *) &input[ii] ) ^ 0x80000000;
            }
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else if (input[ii] < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else
                    output[ii] = (unsigned long) input[ii]; /* copy input */
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) dvalue;
                }
            }
        }
    }
    return(*status);
}